

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O0

void left_shift_3(uint8_t *n)

{
  byte bVar1;
  uint local_18;
  uint8_t next_carry;
  uint i;
  uint8_t carry;
  uint8_t *n_local;
  
  next_carry = '\0';
  for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
    bVar1 = n[local_18];
    n[local_18] = n[local_18] << 3 | next_carry;
    next_carry = (uint8_t)((int)(uint)bVar1 >> 5);
  }
  return;
}

Assistant:

static void left_shift_3(uint8_t n[32]) {
  uint8_t carry = 0;
  unsigned i;

  for (i = 0; i < 32; i++) {
    const uint8_t next_carry = n[i] >> 5;
    n[i] = (n[i] << 3) | carry;
    carry = next_carry;
  }
}